

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O3

Error asmjit::v1_14::a64::FuncInternal::initFuncDetail(FuncDetail *func,FuncSignature *signature)

{
  byte bVar1;
  RegType RVar2;
  FuncDetail FVar3;
  uint uVar4;
  FuncValue *pFVar5;
  RegOrder *pRVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t valueIndex;
  size_t index;
  TypeId TVar10;
  uint uVar11;
  ulong uVar13;
  FuncDetail *pFVar14;
  bool bVar15;
  RegGroup local_52 [2];
  uint local_50;
  uint local_4c;
  FuncDetail *local_48;
  ulong local_40;
  FuncDetail *local_38;
  ulong uVar12;
  
  uVar13 = (ulong)(byte)func[0x74];
  FVar3 = func[2];
  uVar8 = (uint)(FVar3 != (FuncDetail)0x3);
  local_48 = func;
  if (*(int *)(func + 0x8c) != 0) {
    local_40 = CONCAT71(local_40._1_7_,FVar3 != (FuncDetail)0x3);
    pFVar14 = func + 0x8c;
    uVar8 = 0;
    for (index = 0; index != 4; index = index + 1) {
      pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
      uVar11 = pFVar5->_data & 0xff;
      uVar12 = (ulong)uVar11;
      TVar10 = (TypeId)pFVar5->_data;
      if (TVar10 < _kFloatStart) {
        if ((0x5400000000U >> (uVar12 & 0x3f) & 1) == 0) {
          if ((0xa800000000U >> (uVar12 & 0x3f) & 1) == 0) {
            if ((0x30000000000U >> (uVar12 & 0x3f) & 1) == 0) goto LAB_00135897;
            pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
            uVar7 = uVar8 + 0x7000100 + uVar11;
          }
          else {
            pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
            uVar7 = uVar8 | 0x6000127;
          }
        }
        else {
          pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
          uVar7 = uVar8 | 0x6000126;
        }
        pFVar5->_data = uVar7;
      }
      else {
LAB_00135897:
        if (uVar11 == 0) break;
        RVar2 = regTypeFromFpOrVecTypeId(TVar10);
        if (RVar2 == kNone) {
          return 0x1b;
        }
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar14,index);
        pFVar5->_data = ((uint)RVar2 << 0x18 | uVar11) + uVar8 + 0x100;
      }
      uVar8 = uVar8 + 0x10000;
    }
    FVar3 = local_48[2];
    uVar8 = (uint)local_40 & 0xff;
  }
  if ((FVar3 != (FuncDetail)0x3) && (FVar3 != (FuncDetail)0x0)) {
    return 3;
  }
  local_4c = uVar8 * 4 + 4;
  pFVar14 = local_48 + 0x9c;
  local_38 = local_48 + 0x34;
  local_50 = 0;
  uVar8 = 0;
  uVar12 = 0;
  do {
    bVar15 = uVar13 == 0;
    uVar13 = uVar13 - 1;
    uVar11 = (uint)uVar12;
    if (bVar15) {
      *(uint *)(local_48 + 0x88) = uVar11 + 7 & 0xfffffff8;
      return 0;
    }
    uVar9 = *(uint *)pFVar14 & 0xff;
    TVar10 = (TypeId)*(uint *)pFVar14;
    if (uVar9 - 0x20 < 10) {
      local_40 = uVar12;
      if (uVar8 < 0x10) {
        local_52[1] = 0;
        pRVar6 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                 operator[]<asmjit::v1_14::RegGroup>
                           ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_38,local_52 + 1);
        bVar1 = pRVar6->id[uVar8];
        if (bVar1 != 0xff) {
          FuncValue::assignRegData((FuncValue *)pFVar14,kARM_GpX - (TVar10 < kInt64),(uint)bVar1);
          *(uint *)(local_48 + 0x78) = *(uint *)(local_48 + 0x78) | 1 << (bVar1 & 0x1f);
          uVar8 = uVar8 + 1;
          uVar12 = local_40;
          goto LAB_00135a94;
        }
      }
      uVar4 = local_4c;
      if (local_4c <= (byte)TypeUtils::_typeData[(ulong)uVar9 + 0x100]) {
        uVar4 = (uint)(byte)TypeUtils::_typeData[(ulong)uVar9 + 0x100];
      }
      uVar9 = (uint)local_40 + 7 & 0xfffffff8;
      if (uVar4 < 8) {
        uVar9 = (uint)local_40;
      }
LAB_00135a82:
      FuncValue::assignStackOffset((FuncValue *)pFVar14,uVar9);
      uVar12 = (ulong)(uVar9 + uVar4);
    }
    else if (uVar9 - 0x33 < 0x32 || uVar9 - 0x2a < 3) {
      if (local_50 < 0x10) {
        local_52[0] = kVec;
        pRVar6 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                 operator[]<asmjit::v1_14::RegGroup>
                           ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_38,local_52);
        bVar1 = pRVar6->id[local_50];
        if (bVar1 != 0xff) {
          RVar2 = regTypeFromFpOrVecTypeId(TVar10);
          if (RVar2 == kNone) {
            return 0x1b;
          }
          *(uint *)pFVar14 = uVar9;
          FuncValue::assignRegData((FuncValue *)pFVar14,RVar2,(uint)bVar1);
          *(uint *)(local_48 + 0x7c) = *(uint *)(local_48 + 0x7c) | 1 << (bVar1 & 0x1f);
          local_50 = local_50 + 1;
          goto LAB_00135a94;
        }
      }
      uVar4 = local_4c;
      if (local_4c <= (byte)TypeUtils::_typeData[(ulong)uVar9 + 0x100]) {
        uVar4 = (uint)(byte)TypeUtils::_typeData[(ulong)uVar9 + 0x100];
      }
      uVar9 = uVar11 + 7 & 0xfffffff8;
      if (uVar4 < 8) {
        uVar9 = uVar11;
      }
      goto LAB_00135a82;
    }
LAB_00135a94:
    pFVar14 = pFVar14 + 0x10;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature) noexcept {
  DebugUtils::unused(signature);

  const CallConv& cc = func.callConv();
  uint32_t stackOffset = 0;

  uint32_t i;
  uint32_t argCount = func.argCount();

  // Minimum stack size of a single argument passed via stack. The standard AArch64 calling convention
  // specifies 8 bytes, so each function argument would occupy at least 8 bytes even if it needs less.
  // However, Apple has decided to not follow this rule and function argument can occupy less, for
  // example two consecutive 32-bit arguments would occupy 8 bytes total, instead of 16 as specified
  // by ARM.
  uint32_t minStackArgSize = cc.strategy() == CallConvStrategy::kAArch64Apple ? 4u : 8u;

  if (func.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      TypeId typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (typeId == TypeId::kVoid)
        break;

      switch (typeId) {
        case TypeId::kInt8:
        case TypeId::kInt16:
        case TypeId::kInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kInt32);
          break;
        }

        case TypeId::kUInt8:
        case TypeId::kUInt16:
        case TypeId::kUInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kUInt32);
          break;
        }

        case TypeId::kInt64:
        case TypeId::kUInt64: {
          func._rets[valueIndex].initReg(RegType::kARM_GpX, valueIndex, typeId);
          break;
        }

        default: {
          RegType regType = regTypeFromFpOrVecTypeId(typeId);
          if (regType == RegType::kNone)
            return DebugUtils::errored(kErrorInvalidRegType);

          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConvStrategy::kDefault:
    case CallConvStrategy::kAArch64Apple: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (i = 0; i < argCount; i++) {
        FuncValue& arg = func._args[i][0];
        TypeId typeId = arg.typeId();

        if (TypeUtils::isInt(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (gpzPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kGp].id[gpzPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = typeId <= TypeId::kUInt32 ? RegType::kARM_GpW : RegType::kARM_GpX;
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
            gpzPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }

        if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (vecPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kVec].id[vecPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = regTypeFromFpOrVecTypeId(typeId);
            if (regType == RegType::kNone)
              return DebugUtils::errored(kErrorInvalidRegType);

            arg.initTypeId(typeId);
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
            vecPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }
      }
      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  func._argStackSize = Support::alignUp(stackOffset, 8u);
  return kErrorOk;
}